

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD3Importer::ReadSkin(MD3Importer *this,SkinData *fill)

{
  size_type sVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  char cVar5;
  string skin_file;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  cVar5 = (char)&this->filename;
  sVar1 = std::__cxx11::string::rfind(cVar5,0x5f);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = std::__cxx11::string::rfind(cVar5,0x2e);
    if (sVar1 == 0xffffffffffffffff) {
      sVar1 = (this->filename)._M_string_length;
    }
  }
  if (sVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&this->filename);
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)local_50,0,(char *)0x0,(ulong)(this->path)._M_dataplus._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(this->configSkinFile)._M_dataplus._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0.field_2._8_8_ = plVar2[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_d0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    Q3Shader::LoadSkin(fill,&local_d0,this->mIOHandler);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("s != std::string::npos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MD3/MD3Loader.cpp"
                ,0x1f2,"void Assimp::MD3Importer::ReadSkin(Q3Shader::SkinData &) const");
}

Assistant:

void MD3Importer::ReadSkin(Q3Shader::SkinData& fill) const
{
    // skip any postfixes (e.g. lower_1.md3)
    std::string::size_type s = filename.find_last_of('_');
    if (s == std::string::npos) {
        s = filename.find_last_of('.');
        if (s == std::string::npos) {
            s = filename.size();
        }
    }
    ai_assert(s != std::string::npos);

    const std::string skin_file = path + filename.substr(0,s) + "_" + configSkinFile + ".skin";
    Q3Shader::LoadSkin(fill,skin_file,mIOHandler);
}